

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::PosixMmapReadableFile
          (PosixMmapReadableFile *this,string *filename,char *mmap_base,size_t length,
          Limiter *mmap_limiter)

{
  size_type in_RCX;
  size_type in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  RandomAccessFile *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (in_FS_OFFSET + 0x28);
  __str = in_RDI;
  RandomAccessFile::RandomAccessFile(in_stack_ffffffffffffffb8);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__PosixMmapReadableFile_016185a8;
  in_RDI->_M_string_length = in_RDX;
  (in_RDI->field_2)._M_allocated_capacity = in_RCX;
  *(undefined8 *)((long)&in_RDI->field_2 + 8) = in_R8;
  std::__cxx11::string::string(this_00,__str);
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixMmapReadableFile(std::string filename, char* mmap_base, size_t length,
                        Limiter* mmap_limiter)
      : mmap_base_(mmap_base),
        length_(length),
        mmap_limiter_(mmap_limiter),
        filename_(std::move(filename)) {}